

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

bool tinyxml2::XMLUtil::ToInt(char *str,int *value)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  byte bVar3;
  byte *pbVar4;
  uint v;
  undefined8 uStack_28;
  
  bVar3 = *str;
  if (-1 < (char)bVar3) {
    pbVar4 = (byte *)(str + 1);
    uStack_28 = in_RAX;
    do {
      iVar2 = isspace((uint)bVar3);
      if (iVar2 == 0) {
        if ((bVar3 == 0x30) && ((*pbVar4 & 0xdf) == 0x58)) {
          iVar2 = __isoc99_sscanf(str,"%x",(long)&uStack_28 + 4);
          if (iVar2 == 1) {
            *value = uStack_28._4_4_;
            return true;
          }
          goto LAB_001184bc;
        }
        break;
      }
      bVar3 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    } while (-1 < (char)bVar3);
  }
  iVar2 = __isoc99_sscanf(str,"%d",value);
  bVar1 = true;
  if (iVar2 != 1) {
LAB_001184bc:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool XMLUtil::ToInt(const char* str, int* value)
{
    if (IsPrefixHex(str)) {
        unsigned v;
        if (TIXML_SSCANF(str, "%x", &v) == 1) {
            *value = static_cast<int>(v);
            return true;
        }
    }
    else {
        if (TIXML_SSCANF(str, "%d", value) == 1) {
            return true;
        }
    }
    return false;
}